

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O0

void __thiscall
SuffixTest_MutDoubleSuffix_Test::~SuffixTest_MutDoubleSuffix_Test
          (SuffixTest_MutDoubleSuffix_Test *this)

{
  void *in_RDI;
  
  ~SuffixTest_MutDoubleSuffix_Test((SuffixTest_MutDoubleSuffix_Test *)0x1210d8);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, MutDoubleSuffix) {
  mp::MutDoubleSuffix s;
  EXPECT_TRUE(s == 0);
  s = suffixes_.Add<double>("test", 11, 222);
  EXPECT_STREQ("test", s.name());
  EXPECT_EQ(11 | suf::FLOAT, s.kind());
  EXPECT_EQ(222, s.num_values());
  EXPECT_TRUE(IsDouble<mp::DoubleSuffix::Type>::VALUE);
  MutSuffix csuf = s;
  csuf = s;
}